

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int patchtestreg(FuncState *fs,int node,int reg)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = (uint *)((long)&fs->f + (long)node * 4);
  if ((node < 1) || (uVar2 = puVar3[-1], -1 < (char)luaP_opmodes[uVar2 & 0x3f])) {
    uVar2 = *puVar3;
  }
  else {
    puVar3 = puVar3 + -1;
  }
  iVar1 = 0;
  if ((uVar2 & 0x3f) == 0x23) {
    if ((reg == 0xff) || (uVar2 >> 0x17 == reg)) {
      uVar2 = uVar2 & 0x7fc022 | uVar2 >> 0x11 & 0xffffffc0;
    }
    else {
      uVar2 = (reg & 0xffU) << 6 | uVar2 & 0xffffc023;
    }
    *puVar3 = uVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i))
    SETARG_A(*i, reg);
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));
  }
  return 1;
}